

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t local_44;
  wchar_t err2;
  wchar_t err;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  a_local._4_4_ = read_body_to_string(a,tar,&tar->pax_header,h,unconsumed);
  if ((a_local._4_4_ == L'\0') &&
     ((a_local._4_4_ = tar_read_header(a,tar,entry,unconsumed), a_local._4_4_ == L'\0' ||
      (a_local._4_4_ == L'\xffffffec')))) {
    local_44 = pax_header(a,tar,entry,(tar->pax_header).s);
    if (a_local._4_4_ < local_44) {
      local_44 = a_local._4_4_;
    }
    tar->entry_padding = -tar->entry_bytes_remaining & 0x1ff;
    a_local._4_4_ = local_44;
  }
  return a_local._4_4_;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, tar->pax_header.s);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}